

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

IndexVector * __thiscall
Centaurus::CharClass<char>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<char> *this)

{
  pointer pRVar1;
  undefined8 in_RAX;
  Range<char> *r;
  pointer pRVar2;
  undefined8 local_38;
  
  local_38 = in_RAX;
  IndexVector::IndexVector
            (__return_storage_ptr__,
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,true);
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar2 = (this->m_ranges).
                super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    local_38 = (ulong)CONCAT14(pRVar2->m_start,(int)local_38);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
               (int *)((long)&local_38 + 4));
    local_38 = CONCAT44(local_38._4_4_,(uint)(byte)pRVar2->m_end);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(int *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }